

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O3

void __thiscall
UnitTests::Assert::Equals<std::__cxx11::string,std::__cxx11::string>
          (Assert *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *expected,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual)

{
  pointer pcVar1;
  undefined8 uVar2;
  int iVar3;
  ostream *poVar4;
  bool bVar5;
  ostringstream s;
  undefined1 local_1d8 [32];
  Assert *local_1b8;
  expected_got_outputter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  long *local_1a8;
  size_t local_1a0;
  long local_198;
  uint auStack_190 [88];
  
  pcVar1 = (expected->_M_dataplus)._M_p;
  local_1a8 = &local_198;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a8,pcVar1,pcVar1 + expected->_M_string_length);
  local_1d8._0_8_ = local_1d8 + 0x10;
  pcVar1 = (actual->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d8,pcVar1,pcVar1 + actual->_M_string_length);
  uVar2 = local_1d8._0_8_;
  local_1b8 = this;
  if (local_1a0 == local_1d8._8_8_) {
    if (local_1a0 == 0) {
      bVar5 = true;
    }
    else {
      iVar3 = bcmp(local_1a8,(void *)local_1d8._0_8_,local_1a0);
      bVar5 = iVar3 == 0;
    }
  }
  else {
    bVar5 = false;
  }
  if ((string *)uVar2 != (string *)(local_1d8 + 0x10)) {
    operator_delete((void *)uVar2,local_1d8._16_8_ + 1);
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,local_198 + 1);
  }
  if (bVar5) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  if (msg->_M_string_length != 0) {
    local_1d8._0_8_ = msg;
    poVar4 = details::operator<<((ostream *)&local_1a8,
                                 (expected_got_outputter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  }
  *(uint *)((long)auStack_190 + local_1a8[-3]) = *(uint *)((long)auStack_190 + local_1a8[-3]) | 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"    Expected <",0xe);
  local_1d8._0_8_ = local_1d8 + 0x10;
  pcVar1 = (expected->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d8,pcVar1,pcVar1 + expected->_M_string_length);
  local_1b0.t = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8;
  poVar4 = details::operator<<((ostream *)&local_1a8,&local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,">\n",2);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1d8 + 0x10)) {
    operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"     but got <",0xe);
  local_1d8._0_8_ = local_1d8 + 0x10;
  pcVar1 = (actual->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d8,pcVar1,pcVar1 + actual->_M_string_length);
  local_1b0.t = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8;
  poVar4 = details::operator<<((ostream *)&local_1a8,&local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,">\n",2);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1d8 + 0x10)) {
    operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"  ",2);
  std::__cxx11::stringbuf::str();
  Error(local_1b8,(string *)local_1d8);
}

Assistant:

void Equals(const std::string& msg, const T& expected, const U& actual) const
        {
            if (!are_equal(std::common_type_t<T, U>(expected), std::common_type_t<T, U>(actual)))
            {
                auto s = std::ostringstream{};
                if (!msg.empty())
                    s << stream(msg) << " ";

                s << std::boolalpha << "\n";
                s << "    Expected <" << stream_with_coercion(std::common_type_t<T, U>(expected), expected) << ">\n";
                s << "     but got <" << stream_with_coercion(std::common_type_t<T, U>(actual), actual) << ">\n";
                s << "  ";
                Error(s.str());
            }
        }